

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O3

void __thiscall Person::Person(Person *this,string *i,string *n,Address *ad)

{
  int iVar1;
  
  this->_vptr_Person = (_func_int **)&PTR_operator__0010ad20;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->address).country._M_dataplus._M_p = (pointer)&(this->address).country.field_2;
  (this->address).country._M_string_length = 0;
  (this->address).country.field_2._M_local_buf[0] = '\0';
  (this->address).city._M_dataplus._M_p = (pointer)&(this->address).city.field_2;
  (this->address).city._M_string_length = 0;
  (this->address).city.field_2._M_local_buf[0] = '\0';
  (this->address).street._M_dataplus._M_p = (pointer)&(this->address).street.field_2;
  (this->address).street._M_string_length = 0;
  (this->address).street.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->id);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->address);
  std::__cxx11::string::_M_assign((string *)&(this->address).city);
  std::__cxx11::string::_M_assign((string *)&(this->address).street);
  iVar1 = (*this->_vptr_Person[1])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"invalid id",10);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(-1);
}

Assistant:

Person::Person(string i, string n, const Address &ad) {
    id = i;
    name = n;
    address = ad;
    if (!validate()) {
        cout << "invalid id" << endl;
        exit(-1);
    }
}